

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

int voc_lookup_type(voccxdef *ctx,char *p,int len,int of_is_spec)

{
  uint uVar1;
  int iVar2;
  ushort **ppuVar3;
  int in_ECX;
  uint in_EDX;
  byte *in_RSI;
  voccxdef *in_RDI;
  vocdef *v;
  vocwdef *vw;
  int t;
  undefined8 in_stack_ffffffffffffff98;
  uchar *in_stack_ffffffffffffffa0;
  vocwdef *local_58;
  vocwdef *in_stack_ffffffffffffffb8;
  vocwdef *in_stack_ffffffffffffffc0;
  voccxdef *in_stack_ffffffffffffffc8;
  vocdef *local_30;
  vocwdef *local_28;
  uint local_1c;
  
  if (*in_RSI < 0x80) {
    ppuVar3 = __ctype_b_loc();
    iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    if (((*ppuVar3)[(int)(uint)*in_RSI] & 0x100) == 0) goto LAB_00237514;
LAB_0023755c:
    local_1c = 0x20;
  }
  else {
LAB_00237514:
    if (*in_RSI < 0x80) {
      ppuVar3 = __ctype_b_loc();
      iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      if (((((*ppuVar3)[(int)(uint)*in_RSI] & 0x400) == 0) && (*in_RSI != 0x27)) &&
         (*in_RSI != 0x2d)) goto LAB_0023755c;
    }
    local_1c = 0;
    in_stack_ffffffffffffffc8 = in_RDI;
    uVar1 = vochsh(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    for (local_30 = in_stack_ffffffffffffffc8->voccxhsh[uVar1];
        iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20), local_30 != (vocdef *)0x0;
        local_30 = local_30->vocnxt) {
      iVar2 = voceq(in_RSI,in_EDX,local_30->voctxt,(uint)local_30->voclen);
      if (iVar2 != 0) {
        if (local_30->vocwlst == 0xffffffff) {
          local_28 = (vocwdef *)0x0;
          in_stack_ffffffffffffffc0 = local_28;
        }
        else {
          in_stack_ffffffffffffffb8 = in_RDI->voccxwp[(ulong)local_30->vocwlst / 2000];
          local_28 = in_stack_ffffffffffffffb8 + (ulong)local_30->vocwlst % 2000;
          in_stack_ffffffffffffffc0 = local_28;
        }
        while (local_28 != (vocwdef *)0x0) {
          if ((local_28->vocwflg & 8) == 0) {
            if (local_28->vocwtyp == '\a') {
              if (in_EDX == local_30->voclen) {
                local_1c = local_1c | 0x44;
              }
            }
            else {
              local_1c = voctype[local_28->vocwtyp] | local_1c;
            }
          }
          if (local_28->vocwnxt == 0xffffffff) {
            local_58 = (vocwdef *)0x0;
          }
          else {
            local_58 = in_RDI->voccxwp[(ulong)local_28->vocwnxt / 2000] +
                       (ulong)local_28->vocwnxt % 2000;
          }
          local_28 = local_58;
        }
      }
    }
  }
  if (((in_ECX != 0) && (local_1c == 0)) &&
     (iVar2 = voc_check_special(in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,iVar2),
     iVar2 != 0)) {
    local_1c = 0x20;
  }
  return local_1c;
}

Assistant:

static int voc_lookup_type(voccxdef *ctx, char *p, int len, int of_is_spec)
{
    int t;
    
    /* check for a special word */
    if (vocisspec(p))
    {
        /* it's a special word - this is its type */
        t = VOCT_SPEC;
    }
    else
    {
        vocwdef *vw;
        vocdef  *v;

        /*
         *   Now check the various entries of this word to get the word
         *   type flag bits.  The Noun and Adjective flags can be set for
         *   any word which matches this word in the first six letters (or
         *   more if more were provided by the player), but the Plural
         *   flag can only be set if the plural word matches exactly.
         *   Note that this pass only matches the first word in two-word
         *   verbs; the second word is considered later during the
         *   semantic analysis.  
         */
        for (t = 0, v = ctx->voccxhsh[vochsh((uchar *)p, len)] ; v != 0 ;
             v = v->vocnxt)
        {
            /* if this hash chain entry matches, add it to our types */
            if (voceq((uchar *)p, len, v->voctxt, v->voclen))
            {
                /* we have a match - look through relation list for word */
                for (vw = vocwget(ctx, v->vocwlst) ; vw != 0 ;
                     vw = vocwget(ctx, vw->vocwnxt))
                {
                    /* skip this word if it's been deleted */
                    if (vw->vocwflg & VOCFDEL)
                        continue;

                    /* we need a special check for plurals */
                    if (vw->vocwtyp == PRP_PLURAL)
                    {
                        /* plurals must be exact (non-truncated) match */
                        if (len == v->voclen)
                        {
                            /* plurals also count as nouns */
                            t |= (VOCT_NOUN | VOCT_PLURAL);
                        }
                    }
                    else
                    {
                        /* add this type bit to our type value */
                        t |= voctype[vw->vocwtyp];
                    }
                }
            }
        }
    }

    /* check for "of" if the caller wants us to */
    if (of_is_spec && t == 0 && voc_check_special(ctx, p, VOCW_OF))
        t = VOCT_SPEC;

    /* return the type */
    return t;
}